

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

saucy_graph *
buildSim1Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *pModel;
  int *__ptr;
  ulong uVar5;
  saucy_graph *psVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  uVar1 = pNtk->vPos->nSize;
  uVar2 = pNtk->vPis->nSize;
  pModel = generateProperInputVector(pNtk,c,randVec);
  iVar10 = 0;
  if (pModel == (int *)0x0) {
    psVar6 = (saucy_graph *)0x0;
  }
  else {
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      iVar10 = (iVar10 + 1) - (uint)(__ptr[uVar5] == 0);
    }
    psVar6 = (saucy_graph *)malloc(0x18);
    piVar7 = ints(uVar2 + uVar1 + 1);
    piVar8 = ints(iVar10 * uVar2 * 2);
    psVar6->n = uVar2 + uVar1;
    psVar6->e = iVar10 * uVar2;
    psVar6->adj = piVar7;
    psVar6->edg = piVar8;
    *piVar7 = 0;
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      iVar10 = piVar7[uVar5];
      if (__ptr[uVar5] == 0) {
        piVar7[uVar5 + 1] = iVar10;
      }
      else {
        iVar3 = oDep[uVar5]->nSize + iVar10;
        piVar7[uVar5 + 1] = iVar3;
        for (lVar11 = 0; lVar11 + iVar10 < (long)iVar3; lVar11 = lVar11 + 1) {
          iVar3 = Vec_IntEntry(oDep[uVar5],(int)lVar11);
          piVar8[iVar10 + lVar11] = iVar3 + uVar1;
          iVar3 = piVar7[uVar5 + 1];
        }
      }
    }
    uVar5 = 0;
    uVar9 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      iVar10 = piVar7[(long)(int)uVar1 + uVar5];
      piVar7[(long)(int)uVar1 + uVar5 + 1] = iVar10;
      for (iVar3 = 0; iVar3 < iDep[uVar5]->nSize; iVar3 = iVar3 + 1) {
        iVar4 = Vec_IntEntry(iDep[uVar5],iVar3);
        if (__ptr[iVar4] != 0) {
          iVar4 = Vec_IntEntry(iDep[uVar5],iVar3);
          lVar11 = (long)iVar10;
          iVar10 = iVar10 + 1;
          piVar8[lVar11] = iVar4;
          piVar7[(long)(int)uVar1 + uVar5 + 1] = piVar7[(long)(int)uVar1 + uVar5 + 1] + 1;
        }
      }
    }
    free(pModel);
    free(__ptr);
  }
  return psVar6;
}

Assistant:

static struct saucy_graph *
buildSim1Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep )
{
    int i, j, k;
    struct saucy_graph *g;
    int n, e, *adj, *edg;
    int * vPiValues, * output;
    int numOneOutputs = 0;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);

    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern(pNtk, vPiValues);

    for (i = 0; i < numouts; i++) {
        if (output[i])
            numOneOutputs++;
    }

    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    e = numins * numOneOutputs;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;   

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        if (output[i]) {
            adj[i+1] = adj[i] + Vec_IntSize(oDep[i]);
            for (j = adj[i], k = 0; j < adj[i+1]; j++, k++)
                edg[j] = Vec_IntEntry(oDep[i], k) + numouts;
        } else {
            adj[i+1] = adj[i];
        }
    }

    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts];
        for (k = 0, j = adj[i+numouts]; k < Vec_IntSize(iDep[i]); k++) {
            if (output[Vec_IntEntry(iDep[i], k)]) {
                edg[j++] = Vec_IntEntry(iDep[i], k);
                adj[i+numouts+1]++;
            }
        }
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( vPiValues );  
    ABC_FREE( output );
    
    return g;   
}